

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O1

void __thiscall
tchecker::algorithms::reach::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t>
::run_from_waiting(algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t> *this,
                  zg_t *ts,graph_t *graph,
                  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
                  waiting_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
                  *waiting,stats_t *stats)

{
  make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *args;
  pointer ptVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  bool *pbVar5;
  pointer ptVar6;
  tuple<bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
  tVar7;
  node_sptr_t node;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  sst;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
  local_80;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  local_78;
  undefined8 local_58;
  char local_50;
  zg_t *local_48;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t> *local_38;
  
  local_78.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = ts;
  local_40 = labels;
  local_38 = this;
  do {
    iVar3 = (*waiting->_vptr_waiting_t[2])(waiting);
    if ((char)iVar3 != '\0') break;
    iVar3 = (*waiting->_vptr_waiting_t[6])(waiting);
    local_80._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
                   *)0x0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
    ::reset(&local_80,
            *(make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
              **)CONCAT44(extraout_var,iVar3));
    (*waiting->_vptr_waiting_t[5])(waiting);
    puVar4 = stats_t::visited_states(stats);
    *puVar4 = *puVar4 + 1;
    bVar2 = accepting(local_38,&local_80,ts,labels);
    if (bVar2) {
      if (local_80._t ==
          (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
           *)0x0) {
LAB_0013f2a3:
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1db,
                      "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t, tchecker::tck_reach::zg_reach::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t, tchecker::tck_reach::zg_reach::edge_t>>]"
                     );
      }
      tchecker::graph::node_flags_t::final
                (&((local_80._t)->
                  super_node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>
                  ).super_node_t.super_node_flags_t,true);
      pbVar5 = stats_t::reachable(stats);
      *pbVar5 = true;
    }
    else {
      if (local_80._t ==
          (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
           *)0x0) goto LAB_0013f2a3;
      local_58 = 0;
      intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
      ::reset((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
               *)&local_58,
              ((local_80._t)->
              super_node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>
              ).super_node_t.super_node_zg_state_t._state._t);
      zg::zg_t::next(ts,(const_state_sptr_t *)&local_58,&local_78,1);
      intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                  *)&local_58);
      ptVar1 = local_78.
               super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ptVar6 = local_78.
                    super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ptVar6 != ptVar1; ptVar6 = ptVar6 + 1
          ) {
        tVar7 = tchecker::graph::reachability::
                graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
                ::
                add_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>&>
                          ((graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
                            *)&local_58,
                           (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                            *)graph);
        if (local_50 == '\x01') {
          (*waiting->_vptr_waiting_t[4])
                    (waiting,(graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
                              *)&local_58,
                     tVar7.
                     super__Tuple_impl<0UL,_bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
                     ._8_8_);
        }
        args = (ptVar6->
               super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
               ).
               super__Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
               .
               super__Tuple_impl<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
               .
               super__Head_base<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>,_false>
               ._M_head_impl._t;
        if (args == (make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)0x0) {
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1d0,
                        "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::transition_t>]"
                       );
        }
        tchecker::graph::reachability::
        graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
        ::add_edge<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>&>
                  ((graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
                    *)graph,&local_80,(node_sptr_t *)&local_58,args);
        puVar4 = stats_t::visited_transitions(stats);
        *puVar4 = *puVar4 + 1;
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
                    *)&local_58);
      }
      std::
      vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ::_M_erase_at_end(&local_78,
                        local_78.
                        super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      ts = local_48;
      labels = local_40;
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_80);
  } while (!bVar2);
  (*waiting->_vptr_waiting_t[3])(waiting);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void run_from_waiting(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
                        tchecker::waiting::waiting_t<typename GRAPH::node_sptr_t> & waiting,
                        tchecker::algorithms::reach::stats_t & stats)
  {
    std::vector<typename TS::sst_t> sst;

    while (!waiting.empty()) {
      node_sptr_t node = waiting.first();
      waiting.remove_first();

      ++stats.visited_states();

      if (accepting(node, ts, labels)) {
        node->final(true);
        stats.reachable() = true;
        break;
      }

      ts.next(node->state_ptr(), sst);
      for (auto && [status, s, t] : sst) {
        auto && [is_new_node, next_node] = graph.add_node(s);
        if (is_new_node)
          waiting.insert(next_node);
        graph.add_edge(node, next_node, *t);

        ++stats.visited_transitions();
      }
      sst.clear();
    }

    waiting.clear();
  }